

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

string * __thiscall
pbrt::Bounds2<int>::ToString_abi_cxx11_(string *__return_storage_ptr__,Bounds2<int> *this)

{
  Point2<int> *in_R8;
  
  StringPrintf<pbrt::Point2<int>const&,pbrt::Point2<int>const&>
            (__return_storage_ptr__,(pbrt *)"[ %s - %s ]",(char *)this,&this->pMax,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const { return StringPrintf("[ %s - %s ]", pMin, pMax); }